

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O3

Vec_Ptr_t * populateSafetyAssertionVector(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  Abc_Obj_t *pNode;
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  pVVar5 = pNtk->vPos;
  if (pVVar5->nSize < 1) {
    uVar7 = 0;
  }
  else {
    iVar8 = 0;
    uVar10 = 100;
    lVar9 = 0;
    uVar7 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar5->pArray[lVar9];
      iVar2 = nodeName_starts_with(pNode,"assert_safety");
      if ((iVar2 != 0) || (iVar2 = nodeName_starts_with(pNode,"Assert"), iVar2 != 0)) {
        if (pAig->vCos->nSize <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar1 = pAig->vCos->pArray[lVar9];
        iVar2 = (int)uVar10;
        if (iVar8 == iVar2) {
          if (iVar2 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = 0x10;
            uVar10 = 0x10;
          }
          else {
            uVar10 = (ulong)(uint)(iVar2 * 2);
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(uVar10 * 8);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,uVar10 * 8);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = iVar2 * 2;
          }
        }
        else {
          ppvVar4 = pVVar3->pArray;
        }
        lVar6 = (long)iVar8;
        iVar8 = iVar8 + 1;
        pVVar3->nSize = iVar8;
        ppvVar4[lVar6] = pvVar1;
        uVar7 = uVar7 + 1;
      }
      lVar9 = lVar9 + 1;
      pVVar5 = pNtk->vPos;
    } while (lVar9 < pVVar5->nSize);
  }
  printf("Number of safety property found = %d\n",(ulong)uVar7);
  return pVVar3;
}

Assistant:

Vec_Ptr_t * populateSafetyAssertionVector( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    Abc_Obj_t * pNode;
    int i, assertSafetyCounter = 0;
    Vec_Ptr_t * vAssertSafety;

    vAssertSafety = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pNode, i )
        //if( strstr( Abc_ObjName( pNode ), "Assert") != NULL )
        if( nodeName_starts_with( pNode, "assert_safety" ) || nodeName_starts_with( pNode, "Assert" ))
        {
            Vec_PtrPush( vAssertSafety, Aig_ManCo( pAig, i ) );
            assertSafetyCounter++;
        }
    printf("Number of safety property found = %d\n", assertSafetyCounter);
    return vAssertSafety;
}